

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * utext_clone_63(UText *dest,UText *src,UBool deep,UBool readOnly,UErrorCode *status)

{
  UBool UVar1;
  UText *result;
  UErrorCode *status_local;
  UBool readOnly_local;
  UBool deep_local;
  UText *src_local;
  UText *dest_local;
  
  UVar1 = U_FAILURE(*status);
  dest_local = dest;
  if (UVar1 == '\0') {
    dest_local = (*src->pFuncs->clone)(dest,src,deep,status);
    UVar1 = U_FAILURE(*status);
    if (UVar1 == '\0') {
      if (dest_local == (UText *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else if (readOnly != '\0') {
        utext_freeze_63(dest_local);
      }
    }
  }
  return dest_local;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_clone(UText *dest, const UText *src, UBool deep, UBool readOnly, UErrorCode *status) {
    if (U_FAILURE(*status)) {
        return dest;
    }
    UText *result = src->pFuncs->clone(dest, src, deep, status);
    if (U_FAILURE(*status)) {
        return result;
    }
    if (result == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return result;
    }
    if (readOnly) {
        utext_freeze(result);
    }
    return result;
}